

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hkdf.c
# Opt level: O2

int mbedtls_hkdf_expand(mbedtls_md_info_t *md,uchar *prk,size_t prk_len,uchar *info,size_t info_len,
                       uchar *okm,size_t okm_len)

{
  size_t sVar1;
  byte bVar2;
  int iVar3;
  ulong __n;
  size_t ilen;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uchar c;
  size_t local_b8;
  ulong local_b0;
  size_t local_a8;
  uchar *local_a0;
  uchar *local_98;
  mbedtls_md_context_t ctx;
  uchar t [64];
  
  iVar3 = -0x5f80;
  if (okm != (uchar *)0x0) {
    local_b0 = prk_len;
    local_98 = prk;
    bVar2 = mbedtls_md_get_size(md);
    uVar6 = (ulong)bVar2;
    if (bVar2 != 0 && uVar6 <= local_b0) {
      if (info == (uchar *)0x0) {
        info_len = 0;
      }
      local_a0 = "";
      if (info != (uchar *)0x0) {
        local_a0 = info;
      }
      local_b8 = okm_len;
      uVar5 = (okm_len / uVar6 + 1) - (ulong)(okm_len % uVar6 == 0);
      if (uVar5 < 0x100) {
        mbedtls_md_init(&ctx);
        iVar3 = mbedtls_md_setup(&ctx,md,1);
        if (iVar3 == 0) {
          ilen = 0;
          local_a8 = info_len;
          for (uVar4 = 1; iVar3 = 0, uVar4 <= uVar5; uVar4 = uVar4 + 1) {
            c = (uchar)uVar4;
            iVar3 = mbedtls_md_hmac_starts(&ctx,local_98,local_b0);
            if ((((iVar3 != 0) || (iVar3 = mbedtls_md_hmac_update(&ctx,t,ilen), iVar3 != 0)) ||
                (iVar3 = mbedtls_md_hmac_update(&ctx,local_a0,local_a8), iVar3 != 0)) ||
               (iVar3 = mbedtls_md_hmac_update(&ctx,&c,1), iVar3 != 0)) break;
            iVar3 = mbedtls_md_hmac_finish(&ctx,t);
            sVar1 = local_b8;
            if (iVar3 != 0) break;
            __n = uVar6;
            if (uVar5 == uVar4) {
              __n = local_b8;
            }
            memcpy(okm,t,__n);
            okm = okm + uVar6;
            local_b8 = sVar1 - uVar6;
            ilen = uVar6;
          }
        }
        mbedtls_md_free(&ctx);
        mbedtls_platform_zeroize(t,0x40);
      }
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_hkdf_expand( const mbedtls_md_info_t *md, const unsigned char *prk,
                         size_t prk_len, const unsigned char *info,
                         size_t info_len, unsigned char *okm, size_t okm_len )
{
    size_t hash_len;
    size_t where = 0;
    size_t n;
    size_t t_len = 0;
    size_t i;
    int ret = 0;
    mbedtls_md_context_t ctx;
    unsigned char t[MBEDTLS_MD_MAX_SIZE];

    if( okm == NULL )
    {
        return( MBEDTLS_ERR_HKDF_BAD_INPUT_DATA );
    }

    hash_len = mbedtls_md_get_size( md );

    if( prk_len < hash_len || hash_len == 0 )
    {
        return( MBEDTLS_ERR_HKDF_BAD_INPUT_DATA );
    }

    if( info == NULL )
    {
        info = (const unsigned char *) "";
        info_len = 0;
    }

    n = okm_len / hash_len;

    if( (okm_len % hash_len) != 0 )
    {
        n++;
    }

    /*
     * Per RFC 5869 Section 2.3, okm_len must not exceed
     * 255 times the hash length
     */
    if( n > 255 )
    {
        return( MBEDTLS_ERR_HKDF_BAD_INPUT_DATA );
    }

    mbedtls_md_init( &ctx );

    if( (ret = mbedtls_md_setup( &ctx, md, 1) ) != 0 )
    {
        goto exit;
    }

    /*
     * Compute T = T(1) | T(2) | T(3) | ... | T(N)
     * Where T(N) is defined in RFC 5869 Section 2.3
     */
    for( i = 1; i <= n; i++ )
    {
        size_t num_to_copy;
        unsigned char c = i & 0xff;

        ret = mbedtls_md_hmac_starts( &ctx, prk, prk_len );
        if( ret != 0 )
        {
            goto exit;
        }

        ret = mbedtls_md_hmac_update( &ctx, t, t_len );
        if( ret != 0 )
        {
            goto exit;
        }

        ret = mbedtls_md_hmac_update( &ctx, info, info_len );
        if( ret != 0 )
        {
            goto exit;
        }

        /* The constant concatenated to the end of each T(n) is a single octet.
         * */
        ret = mbedtls_md_hmac_update( &ctx, &c, 1 );
        if( ret != 0 )
        {
            goto exit;
        }

        ret = mbedtls_md_hmac_finish( &ctx, t );
        if( ret != 0 )
        {
            goto exit;
        }

        num_to_copy = i != n ? hash_len : okm_len - where;
        memcpy( okm + where, t, num_to_copy );
        where += hash_len;
        t_len = hash_len;
    }

exit:
    mbedtls_md_free( &ctx );
    mbedtls_platform_zeroize( t, sizeof( t ) );

    return( ret );
}